

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O0

PersistentColumnData * duckdb::PersistentColumnData::Deserialize(Deserializer *deserializer)

{
  anon_class_24_3_1b955ccf func;
  PhysicalType PVar1;
  LogicalType *this;
  undefined8 in_RSI;
  PersistentColumnData *in_RDI;
  child_list_t<LogicalType> *child_types;
  PhysicalType physical_type;
  LogicalType *type;
  PersistentColumnData *result;
  undefined8 in_stack_ffffffffffffff38;
  PhysicalType physical_type_p;
  PersistentColumnData *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff58;
  LogicalTypeId id;
  LogicalType *in_stack_ffffffffffffff60;
  vector<duckdb::DataPointer,_true> *in_stack_ffffffffffffff68;
  field_id_t field_id;
  Deserializer *in_stack_ffffffffffffff70;
  field_id_t in_stack_ffffffffffffff7e;
  Deserializer *in_stack_ffffffffffffff80;
  PersistentColumnData *pPVar2;
  LogicalType *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  field_id_t field_idx;
  Deserializer *in_stack_ffffffffffffffb8;
  PersistentColumnData *in_stack_ffffffffffffffc0;
  
  field_idx = (field_id_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
  id = (LogicalTypeId)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  physical_type_p = (PhysicalType)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  pPVar2 = in_RDI;
  this = Deserializer::Get<duckdb::LogicalType_const&>((Deserializer *)0xb95991);
  PVar1 = LogicalType::InternalType(this);
  PersistentColumnData(in_stack_ffffffffffffff40,physical_type_p);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::DataPointer,true>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e,(char *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff68 >> 0x30);
  if (pPVar2->physical_type != BIT) {
    LogicalType::LogicalType(in_stack_ffffffffffffff60,id);
    DeserializeField(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,field_idx,
                     in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    LogicalType::~LogicalType((LogicalType *)0xb95a79);
    if (PVar1 == LIST) {
      ListType::GetChildType((LogicalType *)in_stack_ffffffffffffff40);
      DeserializeField(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,field_idx,
                       in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
    else if (PVar1 == STRUCT) {
      StructType::GetChildTypes_abi_cxx11_((LogicalType *)in_stack_ffffffffffffff40);
      func.child_types = (child_list_t<LogicalType> *)in_RDI;
      func.deserializer = (Deserializer *)in_RSI;
      func.result = pPVar2;
      Deserializer::ReadList<duckdb::PersistentColumnData::Deserialize(duckdb::Deserializer&)::__0>
                (in_stack_ffffffffffffff70,field_id,(char *)in_stack_ffffffffffffff60,func);
    }
    else if (PVar1 == ARRAY) {
      ArrayType::GetChildType((LogicalType *)in_stack_ffffffffffffff40);
      DeserializeField(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,field_idx,
                       in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    }
  }
  return in_RDI;
}

Assistant:

PersistentColumnData PersistentColumnData::Deserialize(Deserializer &deserializer) {
	auto &type = deserializer.Get<const LogicalType &>();
	auto physical_type = type.InternalType();
	PersistentColumnData result(physical_type);
	deserializer.ReadPropertyWithDefault(100, "data_pointers", static_cast<vector<DataPointer> &>(result.pointers));
	if (result.physical_type == PhysicalType::BIT) {
		// validity: return
		return result;
	}
	result.DeserializeField(deserializer, 101, "validity", LogicalTypeId::VALIDITY);
	switch (physical_type) {
	case PhysicalType::ARRAY:
		result.DeserializeField(deserializer, 102, "child_column", ArrayType::GetChildType(type));
		break;
	case PhysicalType::LIST:
		result.DeserializeField(deserializer, 102, "child_column", ListType::GetChildType(type));
		break;
	case PhysicalType::STRUCT: {
		auto &child_types = StructType::GetChildTypes(type);
		deserializer.ReadList(102, "sub_columns", [&](Deserializer::List &list, idx_t i) {
			deserializer.Set<const LogicalType &>(child_types[i].second);
			result.child_columns.push_back(list.ReadElement<PersistentColumnData>());
			deserializer.Unset<LogicalType>();
		});
		break;
	}
	default:
		break;
	}
	return result;
}